

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

bool __thiscall
brotli::HashLongestMatchQuickly<16,_2,_false>::FindLongestMatch
          (HashLongestMatchQuickly<16,_2,_false> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  uint32_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  long local_78;
  uint8_t *local_68;
  
  uVar18 = *best_len_out;
  puVar1 = ring_buffer + (cur_ix & ring_buffer_mask);
  lVar2 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar10 = puVar1[uVar18];
  dVar20 = *best_score_out;
  iVar6 = *distance_cache;
  uVar13 = cur_ix - (long)iVar6;
  if ((uVar13 < cur_ix) &&
     (uVar11 = (uint)uVar13 & (uint)ring_buffer_mask, uVar10 == ring_buffer[uVar18 + uVar11])) {
    if (7 < max_length) {
      uVar9 = max_length & 0xfffffffffffffff8;
      local_68 = puVar1 + uVar9;
      local_78 = 0;
      uVar13 = 0;
LAB_00120164:
      if (*(ulong *)(puVar1 + uVar13 * 8) == *(ulong *)(ring_buffer + uVar13 * 8 + (ulong)uVar11))
      goto code_r0x00120171;
      uVar9 = *(ulong *)(ring_buffer + uVar13 * 8 + (ulong)uVar11) ^ *(ulong *)(puVar1 + uVar13 * 8)
      ;
      uVar13 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar13 = (uVar13 >> 3 & 0x1fffffff) - local_78;
      goto LAB_0012019e;
    }
    uVar9 = 0;
    local_68 = puVar1;
LAB_001203dc:
    uVar16 = max_length & 7;
    uVar13 = uVar9;
    if (uVar16 != 0) {
      uVar17 = uVar9 | uVar16;
      do {
        uVar13 = uVar9;
        if (ring_buffer[uVar9 + uVar11] != *local_68) break;
        local_68 = local_68 + 1;
        uVar9 = uVar9 + 1;
        uVar16 = uVar16 - 1;
        uVar13 = uVar17;
      } while (uVar16 != 0);
    }
LAB_0012019e:
    if (3 < uVar13) {
      auVar21._8_4_ = (int)(uVar13 >> 0x20);
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = 0x45300000;
      dVar20 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)) * 5.4 + 0.6;
      *best_len_out = uVar13;
      *best_len_code_out = uVar13;
      *best_distance_out = (long)iVar6;
      *best_score_out = dVar20;
      uVar10 = puVar1[uVar13];
      bVar4 = true;
      uVar18 = uVar13;
      goto LAB_0012020f;
    }
  }
  bVar4 = false;
LAB_0012020f:
  puVar7 = this->buckets_ + ((ulong)(lVar2 * 0x1e35a7bd000000) >> 0x30);
  uVar13 = (ulong)((uint)max_length & 7);
  iVar6 = 0;
  do {
    uVar11 = *puVar7;
    uVar12 = uVar11 & (uint)ring_buffer_mask;
    if (((uVar10 == ring_buffer[uVar18 + uVar12]) && (cur_ix != uVar11)) &&
       (uVar9 = cur_ix - uVar11, uVar9 <= max_backward)) {
      if (7 < max_length) {
        lVar14 = 0;
        uVar16 = 0;
LAB_001202af:
        if (*(ulong *)(puVar1 + uVar16 * 8) == *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar12))
        goto code_r0x001202bc;
        uVar17 = *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar12) ^
                 *(ulong *)(puVar1 + uVar16 * 8);
        uVar16 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar16 = (uVar16 >> 3 & 0x1fffffff) - lVar14;
        goto LAB_001202e7;
      }
      puVar15 = puVar1;
      uVar17 = 0;
LAB_0012036d:
      uVar16 = uVar17;
      if (uVar13 != 0) {
        uVar5 = uVar17 | uVar13;
        uVar8 = uVar13;
        do {
          uVar16 = uVar17;
          if (ring_buffer[uVar17 + uVar12] != *puVar15) break;
          puVar15 = puVar15 + 1;
          uVar17 = uVar17 + 1;
          uVar8 = uVar8 - 1;
          uVar16 = uVar5;
        } while (uVar8 != 0);
      }
LAB_001202e7:
      if (3 < uVar16) {
        auVar23._8_4_ = (int)(uVar16 >> 0x20);
        auVar23._0_8_ = uVar16;
        auVar23._12_4_ = 0x45300000;
        iVar3 = 0x1f;
        if ((uint)uVar9 != 0) {
          for (; (uint)uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        dVar22 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 +
                 (double)iVar3 * -1.2;
        if (dVar20 < dVar22) {
          *best_len_out = uVar16;
          *best_len_code_out = uVar16;
          *best_distance_out = uVar9;
          *best_score_out = dVar22;
          uVar10 = puVar1[uVar16];
          bVar4 = true;
          uVar18 = uVar16;
          dVar20 = dVar22;
        }
      }
    }
    puVar7 = puVar7 + 1;
    bVar19 = iVar6 != 0;
    iVar6 = iVar6 + 1;
    if (bVar19) {
      *(uint *)((long)this->buckets_ +
               (ulong)(((uint)(ushort)((ulong)(lVar2 * 0x1e35a7bd000000) >> 0x30) +
                       (uint)(((uint)cur_ix >> 3 & 1) != 0)) * 4)) = (uint)cur_ix;
      return bVar4;
    }
  } while( true );
code_r0x00120171:
  uVar13 = uVar13 + 1;
  local_78 = local_78 + -8;
  if (max_length >> 3 == uVar13) goto LAB_001203dc;
  goto LAB_00120164;
code_r0x001202bc:
  uVar16 = uVar16 + 1;
  lVar14 = lVar14 + -8;
  puVar15 = puVar1 + (max_length & 0xfffffffffffffff8);
  uVar17 = max_length & 0xfffffffffffffff8;
  if (max_length >> 3 == uVar16) goto LAB_0012036d;
  goto LAB_001202af;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }